

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_object.cpp
# Opt level: O2

Variable __thiscall
LiteScript::_Type_CLASS_OBJECT::OAssign
          (_Type_CLASS_OBJECT *this,Variable *object_target,Variable *object_src)

{
  State *state;
  ClassObject *obj;
  bool bVar1;
  Object *pOVar2;
  Type *pTVar3;
  Variable *in_RCX;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  Variable VVar5;
  vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> args;
  Variable v;
  undefined1 local_88 [16];
  pointer local_78;
  Variable local_60;
  undefined1 local_50 [32];
  uint *puVar4;
  
  pOVar2 = Variable::operator->(object_src);
  if (*(long *)((long)pOVar2->data + 0x38) == 0) {
    pOVar2 = Variable::operator->(in_RCX);
    pTVar3 = Object::GetType(pOVar2);
    bVar1 = Type::operator==(pTVar3,(Type *)object_target);
    if (!bVar1) {
      pOVar2 = Variable::operator->(object_src);
      VVar5 = Memory::Create((Memory *)this,(Type *)pOVar2->memory);
      puVar4 = VVar5.nb_ref;
      goto LAB_001283fb;
    }
    pOVar2 = Variable::operator->(in_RCX);
    obj = (ClassObject *)pOVar2->data;
    pOVar2 = Variable::operator->(object_src);
    ClassObject::operator=((ClassObject *)pOVar2->data,obj);
  }
  else {
    pOVar2 = Variable::operator->(object_src);
    Class::GetOperator((Class *)local_50,(OperatorType)*(undefined8 *)((long)pOVar2->data + 0x38));
    pOVar2 = Variable::operator->((Variable *)local_50);
    pTVar3 = Object::GetType(pOVar2);
    bVar1 = Type::operator==(pTVar3,(Type *)_type_callback);
    if (bVar1) {
      pOVar2 = Variable::operator->(object_src);
      if (*(long *)((long)pOVar2->data + 0x40) == 0) {
        pOVar2 = Variable::operator->(object_src);
        Memory::Create((Memory *)this,(Type *)pOVar2->memory);
      }
      else {
        pOVar2 = Variable::operator->((Variable *)local_50);
        state = (State *)pOVar2->data;
        Nullable<LiteScript::Variable>::Nullable
                  ((Nullable<LiteScript::Variable> *)local_88,object_src);
        Nullable<LiteScript::Variable>::operator=
                  ((Nullable<LiteScript::Variable> *)&state->nsp_global,
                   (Nullable<LiteScript::Variable> *)local_88);
        Nullable<LiteScript::Variable>::Nullify((Nullable<LiteScript::Variable> *)local_88);
        local_88._0_8_ = (pointer)0x0;
        local_88._8_8_ = (pointer)0x0;
        local_78 = (pointer)0x0;
        Variable::Variable(&local_60,in_RCX);
        std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::
        emplace_back<LiteScript::Variable>
                  ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_88,
                   &local_60);
        Variable::~Variable(&local_60);
        pOVar2 = Variable::operator->(object_src);
        Callback::operator()
                  ((Callback *)this,state,
                   *(vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> **)
                    ((long)pOVar2->data + 0x40));
        std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::~vector
                  ((vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_> *)local_88);
      }
    }
    else {
      pOVar2 = Variable::operator->(in_RCX);
      pTVar3 = Object::GetType(pOVar2);
      pOVar2 = Variable::operator*(object_src);
      (*pTVar3->_vptr_Type[1])(pTVar3,pOVar2);
      pOVar2 = Variable::operator->(object_src);
      pTVar3 = Object::GetType(pOVar2);
      (*pTVar3->_vptr_Type[3])(local_50 + 0x10,pTVar3,object_src);
      Variable::~Variable((Variable *)(local_50 + 0x10));
    }
    Variable::~Variable((Variable *)local_50);
    puVar4 = extraout_RDX;
    if (bVar1) goto LAB_001283fb;
  }
  Variable::Variable((Variable *)this,in_RCX);
  puVar4 = extraout_RDX_00;
LAB_001283fb:
  VVar5.nb_ref = puVar4;
  VVar5.obj = (Object *)this;
  return VVar5;
}

Assistant:

LiteScript::Variable LiteScript::_Type_CLASS_OBJECT::OAssign(Variable &object_target, const Variable &object_src) const {
    if (object_target->GetData<ClassObject>().ClassBase == nullptr) {
        if (object_src->GetType() == *this)
            object_target->GetData<ClassObject>() = object_src->GetData<ClassObject>();
        else
            return object_target->memory.Create(Type::NIL);
    }
    else {
        Variable v = object_target->GetData<ClassObject>().ClassBase->GetOperator(Class::OperatorType::OP_TYPE_ASSIGN);
        if (v->GetType() == Type::CALLBACK) {
            if (object_target->GetData<ClassObject>().ScriptState == nullptr)
                return object_target->memory.Create(Type::NIL);
            Callback &call = v->GetData<Callback>();
            call.This = Nullable<Variable>(object_target);
            std::vector<Variable> args;
            args.push_back(Variable(object_src));
            return call(*(object_target->GetData<ClassObject>().ScriptState), args);
        } else {
            object_src->GetType().AssignObject(*object_target);
            object_target->GetType().OAssign(object_target, object_src);
        }
    }
    return object_src;
}